

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Uint64(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,uint64_t u64)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *buffer;
  char *pcVar3;
  
  Prefix(this,kNumberType);
  buffer = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,0x14);
  pcVar3 = internal::u64toa(u64,buffer);
  pGVar1 = this->os_;
  pcVar2 = (pGVar1->stack_).stackTop_;
  if (((long)buffer - (long)pcVar3) + 0x14U <= (ulong)((long)pcVar2 - (long)(pGVar1->stack_).stack_)
     ) {
    (pGVar1->stack_).stackTop_ = pcVar2 + (-0x14 - ((long)buffer - (long)pcVar3));
    return true;
  }
  __assert_fail("GetSize() >= count * sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/internal/stack.h"
                ,0x8a,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool Uint64(uint64_t u64)   { Prefix(kNumberType); return EndValue(WriteUint64(u64)); }